

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

void md5_32(void *key,int len,uint32_t seed,void *out)

{
  undefined4 *in_RCX;
  uint hash [4];
  uint32_t in_stack_000000cc;
  uchar *in_stack_000000d0;
  int in_stack_000000dc;
  uchar *in_stack_000000e0;
  undefined4 local_28;
  
  md5(in_stack_000000e0,in_stack_000000dc,in_stack_000000d0,in_stack_000000cc);
  *in_RCX = local_28;
  return;
}

Assistant:

void md5_32            ( const void * key, int len, uint32_t seed, void * out )
{
  unsigned int hash[4];

  md5((unsigned char*)key,len,(unsigned char*)hash, seed);

  *(uint32_t*)out = hash[0];
}